

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::get_append
          (CImg<unsigned_char> *__return_storage_ptr__,CImgList<unsigned_char> *this,char axis,
          float align)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  long lVar4;
  CImg<unsigned_char> *pCVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  
  pCVar5 = this->_data;
  uVar11 = this->_width;
  if (uVar11 == 0 || pCVar5 == (CImg<unsigned_char> *)0x0) {
    __return_storage_ptr__->_data = (uchar *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
  }
  else {
    uVar9 = (ulong)uVar11;
    if (uVar11 == 1) {
      CImg<unsigned_char>::CImg(__return_storage_ptr__,pCVar5,false);
    }
    else {
      __return_storage_ptr__->_data = (uchar *)0x0;
      __return_storage_ptr__->_width = 0;
      __return_storage_ptr__->_height = 0;
      __return_storage_ptr__->_depth = 0;
      __return_storage_ptr__->_spectrum = 0;
      __return_storage_ptr__->_is_shared = false;
      cVar3 = axis + ' ';
      if ((byte)(axis + 0xa5U) < 0xe6) {
        cVar3 = axis;
      }
      if (cVar3 == 'x') {
        if ((int)uVar11 < 1) {
          uVar6 = 0;
          uVar11 = 0;
          uVar10 = 0;
          uVar7 = 0;
        }
        else {
          lVar4 = 0;
          uVar7 = 0;
          uVar10 = 0;
          uVar11 = 0;
          uVar6 = 0;
          do {
            uVar6 = uVar6 + *(int *)((long)&pCVar5->_width + lVar4);
            uVar1 = *(uint *)((long)&pCVar5->_height + lVar4);
            uVar2 = *(uint *)((long)&pCVar5->_depth + lVar4);
            if (uVar1 < uVar11) {
              uVar1 = uVar11;
            }
            uVar11 = uVar1;
            if (uVar2 < uVar10) {
              uVar2 = uVar10;
            }
            uVar10 = uVar2;
            uVar1 = *(uint *)((long)&pCVar5->_spectrum + lVar4);
            if (uVar1 < uVar7) {
              uVar1 = uVar7;
            }
            uVar7 = uVar1;
            lVar4 = lVar4 + 0x20;
          } while (uVar9 << 5 != lVar4);
        }
        pCVar5 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar6,uVar11,uVar10,uVar7);
        CImg<unsigned_char>::fill(pCVar5,'\0');
        if ((__return_storage_ptr__->_data != (uchar *)0x0) && (0 < (int)this->_width)) {
          lVar8 = 0;
          lVar4 = 0;
          iVar12 = 0;
          do {
            pCVar5 = this->_data;
            CImg<unsigned_char>::draw_image
                      (__return_storage_ptr__,iVar12,
                       (int)((float)(uVar11 - *(int *)((long)&pCVar5->_height + lVar8)) * align),
                       (int)((float)(uVar10 - *(int *)((long)&pCVar5->_depth + lVar8)) * align),
                       (int)((float)(uVar7 - *(int *)((long)&pCVar5->_spectrum + lVar8)) * align),
                       (CImg<unsigned_char> *)((long)&pCVar5->_width + lVar8),1.0);
            iVar12 = iVar12 + *(int *)((long)&this->_data->_width + lVar8);
            lVar4 = lVar4 + 1;
            lVar8 = lVar8 + 0x20;
          } while (lVar4 < (int)this->_width);
        }
      }
      else if (cVar3 == 'y') {
        if ((int)uVar11 < 1) {
          uVar11 = 0;
          uVar6 = 0;
          uVar10 = 0;
          uVar7 = 0;
        }
        else {
          lVar4 = 0;
          uVar7 = 0;
          uVar10 = 0;
          uVar6 = 0;
          uVar11 = 0;
          do {
            uVar1 = *(uint *)((long)&pCVar5->_width + lVar4);
            if (uVar1 < uVar11) {
              uVar1 = uVar11;
            }
            uVar11 = uVar1;
            uVar1 = *(uint *)((long)&pCVar5->_depth + lVar4);
            uVar6 = uVar6 + *(int *)((long)&pCVar5->_height + lVar4);
            if (uVar1 < uVar10) {
              uVar1 = uVar10;
            }
            uVar10 = uVar1;
            uVar1 = *(uint *)((long)&pCVar5->_spectrum + lVar4);
            if (uVar1 < uVar7) {
              uVar1 = uVar7;
            }
            uVar7 = uVar1;
            lVar4 = lVar4 + 0x20;
          } while (uVar9 << 5 != lVar4);
        }
        pCVar5 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar11,uVar6,uVar10,uVar7);
        CImg<unsigned_char>::fill(pCVar5,'\0');
        if ((__return_storage_ptr__->_data != (uchar *)0x0) && (0 < (int)this->_width)) {
          lVar8 = 0;
          lVar4 = 0;
          iVar12 = 0;
          do {
            pCVar5 = this->_data;
            CImg<unsigned_char>::draw_image
                      (__return_storage_ptr__,
                       (int)((float)(uVar11 - *(int *)((long)&pCVar5->_width + lVar8)) * align),
                       iVar12,(int)((float)(uVar10 - *(int *)((long)&pCVar5->_depth + lVar8)) *
                                   align),
                       (int)((float)(uVar7 - *(int *)((long)&pCVar5->_spectrum + lVar8)) * align),
                       (CImg<unsigned_char> *)((long)&pCVar5->_width + lVar8),1.0);
            iVar12 = iVar12 + *(int *)((long)&this->_data->_height + lVar8);
            lVar4 = lVar4 + 1;
            lVar8 = lVar8 + 0x20;
          } while (lVar4 < (int)this->_width);
        }
      }
      else if (cVar3 == 'z') {
        if ((int)uVar11 < 1) {
          uVar11 = 0;
          uVar10 = 0;
          uVar6 = 0;
          uVar7 = 0;
        }
        else {
          lVar4 = 0;
          uVar7 = 0;
          uVar6 = 0;
          uVar10 = 0;
          uVar11 = 0;
          do {
            uVar1 = *(uint *)((long)&pCVar5->_width + lVar4);
            uVar2 = *(uint *)((long)&pCVar5->_height + lVar4);
            if (uVar1 < uVar11) {
              uVar1 = uVar11;
            }
            uVar11 = uVar1;
            if (uVar2 < uVar10) {
              uVar2 = uVar10;
            }
            uVar10 = uVar2;
            uVar6 = uVar6 + *(int *)((long)&pCVar5->_depth + lVar4);
            uVar1 = *(uint *)((long)&pCVar5->_spectrum + lVar4);
            if (uVar1 < uVar7) {
              uVar1 = uVar7;
            }
            uVar7 = uVar1;
            lVar4 = lVar4 + 0x20;
          } while (uVar9 << 5 != lVar4);
        }
        pCVar5 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar11,uVar10,uVar6,uVar7);
        CImg<unsigned_char>::fill(pCVar5,'\0');
        if ((__return_storage_ptr__->_data != (uchar *)0x0) && (0 < (int)this->_width)) {
          lVar8 = 0;
          lVar4 = 0;
          iVar12 = 0;
          do {
            pCVar5 = this->_data;
            CImg<unsigned_char>::draw_image
                      (__return_storage_ptr__,
                       (int)((float)(uVar11 - *(int *)((long)&pCVar5->_width + lVar8)) * align),
                       (int)((float)(uVar10 - *(int *)((long)&pCVar5->_height + lVar8)) * align),
                       iVar12,(int)((float)(uVar7 - *(int *)((long)&pCVar5->_spectrum + lVar8)) *
                                   align),(CImg<unsigned_char> *)((long)&pCVar5->_width + lVar8),1.0
                      );
            iVar12 = iVar12 + *(int *)((long)&this->_data->_depth + lVar8);
            lVar4 = lVar4 + 1;
            lVar8 = lVar8 + 0x20;
          } while (lVar4 < (int)this->_width);
        }
      }
      else {
        if ((int)uVar11 < 1) {
          uVar11 = 0;
          uVar10 = 0;
          uVar7 = 0;
          uVar6 = 0;
        }
        else {
          lVar4 = 0;
          uVar6 = 0;
          uVar7 = 0;
          uVar10 = 0;
          uVar11 = 0;
          do {
            uVar1 = *(uint *)((long)&pCVar5->_width + lVar4);
            uVar2 = *(uint *)((long)&pCVar5->_height + lVar4);
            if (uVar1 < uVar11) {
              uVar1 = uVar11;
            }
            uVar11 = uVar1;
            if (uVar2 < uVar10) {
              uVar2 = uVar10;
            }
            uVar10 = uVar2;
            uVar1 = *(uint *)((long)&pCVar5->_depth + lVar4);
            if (uVar1 < uVar7) {
              uVar1 = uVar7;
            }
            uVar7 = uVar1;
            uVar6 = uVar6 + *(int *)((long)&pCVar5->_spectrum + lVar4);
            lVar4 = lVar4 + 0x20;
          } while (uVar9 << 5 != lVar4);
        }
        pCVar5 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar11,uVar10,uVar7,uVar6);
        CImg<unsigned_char>::fill(pCVar5,'\0');
        if ((__return_storage_ptr__->_data != (uchar *)0x0) && (0 < (int)this->_width)) {
          lVar8 = 0;
          lVar4 = 0;
          iVar12 = 0;
          do {
            pCVar5 = this->_data;
            CImg<unsigned_char>::draw_image
                      (__return_storage_ptr__,
                       (int)((float)(uVar11 - *(int *)((long)&pCVar5->_width + lVar8)) * align),
                       (int)((float)(uVar10 - *(int *)((long)&pCVar5->_height + lVar8)) * align),
                       (int)((float)(uVar7 - *(int *)((long)&pCVar5->_depth + lVar8)) * align),
                       iVar12,(CImg<unsigned_char> *)((long)&pCVar5->_width + lVar8),1.0);
            iVar12 = iVar12 + *(int *)((long)&this->_data->_spectrum + lVar8);
            lVar4 = lVar4 + 1;
            lVar8 = lVar8 + 0x20;
          } while (lVar4 < (int)this->_width);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_append(const char axis, const float align=0) const {
      if (is_empty()) return CImg<T>();
      if (_width==1) return +((*this)[0]);
      unsigned int dx = 0, dy = 0, dz = 0, dc = 0, pos = 0;
      CImg<T> res;
      switch (cimg::uncase(axis)) {
      case 'x' : { // Along the X-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          dx+=img._width; dy = cimg::max(dy,img._height); dz = cimg::max(dz,img._depth); dc = cimg::max(dc,img._spectrum);
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            res.draw_image(pos,
                           (int)(align*(dy-(*this)[l]._height)),
                           (int)(align*(dz-(*this)[l]._depth)),
                           (int)(align*(dc-(*this)[l]._spectrum)),
                           (*this)[l]);
            pos+=(*this)[l]._width;
          }
      } break;
      case 'y' : { // Along the Y-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          dx = cimg::max(dx,img._width); dy+=img._height; dz = cimg::max(dz,img._depth); dc = cimg::max(dc,img._spectrum);
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            res.draw_image((int)(align*(dx-(*this)[l]._width)),
                           pos,
                           (int)(align*(dz-(*this)[l]._depth)),
                           (int)(align*(dc-(*this)[l]._spectrum)),
                           (*this)[l]);
            pos+=(*this)[l]._height;
          }
      } break;
      case 'z' : { // Along the Z-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          dx = cimg::max(dx,img._width); dy = cimg::max(dy,img._height); dz+=img._depth; dc = cimg::max(dc,img._spectrum);
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            res.draw_image((int)(align*(dx-(*this)[l]._width)),
                           (int)(align*(dy-(*this)[l]._height)),
                           pos,
                           (int)(align*(dc-(*this)[l]._spectrum)),
                           (*this)[l]);
            pos+=(*this)[l]._depth;
          }
      } break;
      default : { // Along the C-axis.
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          dx = cimg::max(dx,img._width); dy = cimg::max(dy,img._height); dz = cimg::max(dz,img._depth); dc+=img._spectrum;
        }
        res.assign(dx,dy,dz,dc,0);
        if (res) cimglist_for(*this,l) {
            res.draw_image((int)(align*(dx-(*this)[l]._width)),
                           (int)(align*(dy-(*this)[l]._height)),
                           (int)(align*(dz-(*this)[l]._depth)),
                           pos,
                           (*this)[l]);
            pos+=(*this)[l]._spectrum;
          }
      }
      }
      return res;
    }